

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen_c_builder.c
# Opt level: O3

int gen_union_fields(fb_output_t *out,char *st,int n,char *s,fb_compound_type_t *ct,int is_vector)

{
  fb_scoped_name_t *pfVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t uVar4;
  short sVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined4 uVar8;
  enum_entry_t *peVar9;
  uint uVar10;
  int iVar11;
  ulong extraout_RAX;
  ulong uVar12;
  fb_schema_t *pfVar13;
  entry_t *peVar14;
  entry_t *peVar15;
  entry_t *peVar16;
  dict_entry_t *__base;
  size_t sVar17;
  int iVar18;
  undefined8 *puVar19;
  code *pcVar20;
  undefined8 uVar21;
  undefined4 in_register_00000014;
  fb_symbol_t *pfVar22;
  code *pcVar23;
  uint64_t uVar24;
  long lVar25;
  fb_scope_t *pfVar26;
  undefined8 *puVar27;
  fb_symbol_t *pfVar28;
  fb_output_t *pfVar29;
  size_t sVar30;
  char *__format;
  char *pcVar31;
  fb_output_t *pfVar32;
  FILE *pFVar33;
  undefined1 *puVar34;
  fb_output_t *pfVar35;
  fb_output_t *sn;
  fb_output_t *pfVar36;
  undefined4 in_register_0000008c;
  long *plVar37;
  long lVar38;
  uint uVar39;
  char *pcVar40;
  fb_symbol_t *pfVar41;
  fb_compound_type_t *ct_00;
  size_t sVar42;
  bool bVar43;
  undefined8 uStack_948;
  uint *puStack_940;
  undefined1 *puStack_938;
  undefined1 auStack_928 [24];
  undefined8 uStack_910;
  fb_output_t *pfStack_908;
  fb_output_t *pfStack_900;
  fb_output_t *pfStack_878;
  ulong uStack_870;
  entry_t *peStack_868;
  size_t sStack_860;
  code *pcStack_858;
  byte bStack_849;
  uint uStack_848;
  int iStack_844;
  fb_root_schema_t *pfStack_840;
  size_t sStack_838;
  undefined1 auStack_830 [8];
  gen_match_f *pgStack_828;
  gen_unmatched_f *pgStack_820;
  fb_compound_type_t *pfStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 auStack_740 [24];
  object_entry_t *poStack_728;
  enum_entry_t *peStack_720;
  service_entry_t *psStack_718;
  char *pcStack_710;
  object_entry_t *poStack_708;
  enum_entry_t *peStack_700;
  service_entry_t *psStack_6f8;
  char *pcStack_6f0;
  fb_schema_t *pfStack_6e8;
  FILE *pFStack_658;
  undefined8 *puStack_650;
  fb_output_t *pfStack_648;
  fb_scoped_name_t *pfStack_640;
  FILE *pFStack_638;
  char *pcStack_630;
  undefined1 auStack_620 [464];
  fb_output_t *pfStack_450;
  undefined1 *puStack_448;
  undefined8 *puStack_440;
  fb_symbol_t *pfStack_438;
  fb_output_t *pfStack_430;
  fb_output_t *pfStack_428;
  fb_output_t *pfStack_420;
  undefined1 auStack_418 [232];
  undefined1 auStack_330 [248];
  fb_scoped_name_t *pfStack_238;
  fb_scope_t *pfStack_230;
  fb_scoped_name_t *pfStack_228;
  fb_scoped_name_t *pfStack_220;
  fb_output_t *local_218;
  fb_scope_t *local_210;
  char *local_208;
  fb_scoped_name_t snref;
  fb_scoped_name_t snu;
  
  pfVar36 = (fb_output_t *)CONCAT44(in_register_0000008c,is_vector);
  local_210 = (fb_scope_t *)CONCAT44(in_register_00000014,n);
  pcVar40 = "vector_value";
  if (is_vector == 0) {
    pcVar40 = "value";
  }
  pfStack_220 = (fb_scoped_name_t *)0x110164;
  pfVar35 = (fb_output_t *)ct;
  local_218 = (fb_output_t *)st;
  local_208 = s;
  memset(&snref,0,0xe8);
  pfStack_220 = (fb_scoped_name_t *)0x110178;
  memset(&snu,0,0xe8);
  pfVar32 = (fb_output_t *)ct->scope;
  pfStack_220 = (fb_scoped_name_t *)0x110187;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar32,&ct->symbol,&snref);
  pfVar28 = ct->members;
  uVar12 = extraout_RAX;
  while( true ) {
    if (pfVar28 == (fb_symbol_t *)0x0) {
      return (int)uVar12;
    }
    uVar3 = pfVar28[1].kind;
    uVar12 = (ulong)uVar3;
    if (uVar3 != 0) break;
LAB_0011026f:
    pfVar28 = pfVar28->link;
  }
  pcVar31 = pfVar28->ident->text;
  pfVar26 = (fb_scope_t *)(ulong)(uint)pfVar28->ident->len;
  if (uVar3 == 0xb) {
    pfVar32 = (fb_output_t *)out->fp;
    __format = "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n";
LAB_00110254:
    pfStack_238 = &snref;
    auStack_330._240_8_ = local_208;
    auStack_330._232_8_ = local_210;
    auStack_330._224_8_ = (fb_options_t *)0x11026b;
    pfVar35 = out;
    pfVar36 = local_218;
    pfStack_230 = pfVar26;
    pfStack_228 = (fb_scoped_name_t *)pcVar31;
    uVar10 = fprintf((FILE *)pfVar32,__format,out,pcVar40);
    uVar12 = (ulong)uVar10;
    goto LAB_0011026f;
  }
  if (uVar3 == 0xf) {
    pfVar32 = (fb_output_t *)pfVar28[1].link[1].link;
    pfStack_220 = (fb_scoped_name_t *)0x1101d0;
    __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar32,pfVar28[1].link,&snu);
    uVar4 = (pfVar28[1].link)->kind;
    if (uVar4 == 1) {
      pfVar32 = (fb_output_t *)out->fp;
      __format = "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_220 = &snu;
    }
    else {
      if (uVar4 != 0) goto LAB_0011028f;
      pfVar32 = (fb_output_t *)out->fp;
      __format = "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n";
      pfStack_220 = &snu;
    }
    goto LAB_00110254;
  }
  pfStack_220 = (fb_scoped_name_t *)0x11028f;
  gen_union_fields_cold_2();
LAB_0011028f:
  pfStack_220 = (fb_scoped_name_t *)__flatcc_fb_gen_c_verifier;
  gen_union_fields_cold_1();
  pfStack_428 = (fb_output_t *)0x1102ce;
  auStack_330._232_8_ = pfVar26;
  auStack_330._240_8_ = out;
  pfStack_238 = (fb_scoped_name_t *)pcVar40;
  pfStack_230 = (fb_scope_t *)pcVar31;
  pfStack_228 = &snu;
  pfStack_220 = (fb_scoped_name_t *)pfVar28;
  fprintf((FILE *)pfVar32->fp,"#ifndef %s_VERIFIER_H\n#define %s_VERIFIER_H\n",
          pfVar32->S->basenameup);
  pfStack_428 = (fb_output_t *)0x1102eb;
  fwrite("\n/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */\n\n",0x51
         ,1,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x11030e;
  fprintf((FILE *)pfVar32->fp,"#ifndef %s_READER_H\n",pfVar32->S->basenameup);
  pfStack_428 = (fb_output_t *)0x110331;
  fprintf((FILE *)pfVar32->fp,"#include \"%s_reader.h\"\n",pfVar32->S->basename);
  pfStack_428 = (fb_output_t *)0x11034e;
  fwrite("#endif\n",7,1,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x11036b;
  fwrite("#include \"flatcc/flatcc_verifier.h\"\n",0x24,1,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x110381;
  __flatcc_fb_gen_c_includes(pfVar32,"_verifier.h","_VERIFIER_H");
  if (pfVar32->opts->cgen_pragmas != 0) {
    pfStack_428 = (fb_output_t *)0x1103ae;
    fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,(FILE *)pfVar32->fp);
  }
  pfStack_428 = (fb_output_t *)0x1103bf;
  fputc(10,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x1103d0;
  memset(auStack_418,0,0xe8);
  pfVar28 = pfVar32->S->symbols;
  if (pfVar28 != (fb_symbol_t *)0x0) {
    do {
      if (pfVar28->kind == 0) {
        pfStack_428 = (fb_output_t *)0x110403;
        __flatcc_fb_scoped_symbol_name
                  ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_418);
        pfStack_428 = (fb_output_t *)0x110417;
        fprintf((FILE *)pfVar32->fp,
                "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td);\n",
                (fb_scoped_name_t *)auStack_418);
      }
      pfVar28 = pfVar28->link;
    } while (pfVar28 != (fb_symbol_t *)0x0);
  }
  pfStack_428 = (fb_output_t *)0x110430;
  fputc(10,(FILE *)pfVar32->fp);
  pfVar28 = pfVar32->S->symbols;
  if (pfVar28 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  do {
    if (pfVar28->kind == 4) {
      pfStack_428 = (fb_output_t *)0x11046c;
      memset((fb_scoped_name_t *)auStack_418,0,0xe8);
      pfStack_428 = (fb_output_t *)0x11047b;
      memset((fb_scoped_name_t *)auStack_330,0,0xe8);
      pfStack_428 = (fb_output_t *)0x11048a;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_418);
      pFVar33 = (FILE *)pfVar32->fp;
      pfStack_428 = (fb_output_t *)0x1104a2;
      fprintf(pFVar33,
              "static int %s_union_verifier(flatcc_union_verifier_descriptor_t *ud)\n{\n    switch (ud->type) {\n"
              ,(fb_scoped_name_t *)auStack_418);
      for (puVar27 = *(undefined8 **)&pfVar28[1].kind; puVar27 != (undefined8 *)0x0;
          puVar27 = (undefined8 *)*puVar27) {
        sVar5 = *(short *)(puVar27 + 5);
        sn = pfVar35;
        if (sVar5 != 0) {
          sn = *(fb_output_t **)puVar27[1];
          uVar10 = *(uint *)((undefined8 *)puVar27[1] + 1);
          pfVar29 = (fb_output_t *)(ulong)uVar10;
          if (sVar5 == 0xb) {
            pFVar33 = (FILE *)pfVar32->fp;
            pfStack_428 = (fb_output_t *)0x11053b;
            fprintf(pFVar33,"    case %u: return flatcc_verify_union_string(ud); /* %.*s */\n",
                    (ulong)*(uint *)(puVar27 + 9),pfVar29);
          }
          else {
            if (sVar5 != 0xf) {
              pfStack_428 = (fb_output_t *)0x110c09;
              __flatcc_fb_gen_c_verifier_cold_2();
LAB_00110c09:
              pfStack_428 = (fb_output_t *)0x110c0e;
              __flatcc_fb_gen_c_verifier_cold_1();
              goto switchD_001108d3_caseD_2;
            }
            pFVar33 = (FILE *)((fb_symbol_t *)puVar27[3])[1].link;
            pfStack_428 = (fb_output_t *)0x1104e4;
            __flatcc_fb_scoped_symbol_name
                      ((fb_scope_t *)pFVar33,(fb_symbol_t *)puVar27[3],
                       (fb_scoped_name_t *)auStack_330);
            lVar38 = puVar27[3];
            if (*(short *)(lVar38 + 0x10) == 1) {
              pFVar33 = (FILE *)pfVar32->fp;
              pfVar36 = (fb_output_t *)(ulong)*(ushort *)(lVar38 + 0xb8);
              pfStack_428 = (fb_output_t *)0x11056c;
              pfStack_420 = sn;
              fprintf(pFVar33,
                      "    case %u: return flatcc_verify_union_struct(ud, %lu, %u); /* %.*s */\n",
                      (ulong)*(uint *)(puVar27 + 9),*(undefined8 *)(lVar38 + 0xc0));
              sn = pfVar36;
              pfVar36 = pfVar29;
            }
            else {
              if (*(short *)(lVar38 + 0x10) != 0) goto LAB_00110c09;
              pFVar33 = (FILE *)pfVar32->fp;
              pfVar35 = (fb_output_t *)(ulong)uVar10;
              pfStack_428 = (fb_output_t *)0x11051b;
              pfVar36 = sn;
              fprintf(pFVar33,
                      "    case %u: return flatcc_verify_union_table(ud, %s_verify_table); /* %.*s */\n"
                      ,(ulong)*(uint *)(puVar27 + 9),(fb_scoped_name_t *)auStack_330);
              sn = pfVar35;
            }
          }
        }
        pfVar35 = sn;
      }
      pfStack_428 = (fb_output_t *)0x110592;
      fwrite("    default: return flatcc_verify_ok;\n    }\n}\n\n",0x2f,1,(FILE *)pfVar32->fp);
    }
    pfVar28 = pfVar28->link;
  } while (pfVar28 != (fb_symbol_t *)0x0);
  pfVar28 = pfVar32->S->symbols;
  if (pfVar28 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  do {
    if (pfVar28->kind == 1) {
      pfStack_428 = (fb_output_t *)0x1105e7;
      memset((fb_scoped_name_t *)auStack_418,0,0xe8);
      pfStack_428 = (fb_output_t *)0x1105f6;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_418);
      pfStack_428 = (fb_output_t *)0x110620;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,(fb_scoped_name_t *)auStack_418,pfVar28[8].link,
              (ulong)pfVar28[7].kind);
      pfStack_428 = (fb_output_t *)0x11064a;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, %s_identifier, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,(fb_scoped_name_t *)auStack_418,pfVar28[8].link,
              (ulong)pfVar28[7].kind);
      pfStack_428 = (fb_output_t *)0x110674;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,(fb_scoped_name_t *)auStack_418,pfVar28[8].link,
              (ulong)pfVar28[7].kind);
      pfStack_428 = (fb_output_t *)0x11069e;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, %s_type_hash, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,(fb_scoped_name_t *)auStack_418,pfVar28[8].link,
              (ulong)pfVar28[7].kind);
      pfStack_428 = (fb_output_t *)0x1106c8;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root(buf, bufsiz, thash, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,pfVar32,pfVar28[8].link,(ulong)pfVar28[7].kind);
      pfVar36 = (fb_output_t *)(ulong)pfVar28[7].kind;
      pfStack_428 = (fb_output_t *)0x1106ee;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_struct_as_typed_root_with_size(buf, bufsiz, thash, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,pfVar32,pfVar28[8].link);
      pfStack_428 = (fb_output_t *)0x110711;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root(buf, bufsiz, fid, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,pfVar28[8].link,(ulong)pfVar28[7].kind);
      pfVar35 = (fb_output_t *)(ulong)pfVar28[7].kind;
      pfStack_428 = (fb_output_t *)0x110734;
      fprintf((FILE *)pfVar32->fp,
              "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_struct_as_root_with_size(buf, bufsiz, fid, %lu, %u);\n}\n\n"
              ,(fb_scoped_name_t *)auStack_418,pfVar28[8].link);
    }
    pfVar28 = pfVar28->link;
  } while (pfVar28 != (fb_symbol_t *)0x0);
  pfVar28 = pfVar32->S->symbols;
  if (pfVar28 == (fb_symbol_t *)0x0) goto LAB_00110ba0;
  sn = (fb_output_t *)auStack_418;
LAB_00110761:
  if (pfVar28->kind != 0) goto LAB_00110b94;
  pfStack_428 = (fb_output_t *)0x11077c;
  memset(sn,0,0xe8);
  pfStack_428 = (fb_output_t *)0x11078b;
  memset((fb_output_t *)auStack_330,0,0xe8);
  pfStack_428 = (fb_output_t *)0x11079a;
  __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)sn);
  pfStack_428 = (fb_output_t *)0x1107b2;
  fprintf((FILE *)pfVar32->fp,
          "static int %s_verify_table(flatcc_table_verifier_descriptor_t *td)\n{\n",sn);
  puVar27 = *(undefined8 **)&pfVar28[1].kind;
  if (puVar27 == (undefined8 *)0x0) goto LAB_00110a70;
  bVar43 = false;
LAB_001107c1:
  if ((*(byte *)(puVar27 + 0xe) & 4) != 0) goto code_r0x001107c8;
  if (bVar43) {
    sVar42 = 0x1e;
    pcVar40 = ")) return ret;\n    if ((ret = ";
  }
  else {
    sVar42 = 0x1c;
    pcVar40 = "    int ret;\n    if ((ret = ";
  }
  pfStack_428 = (fb_output_t *)0x11080a;
  fwrite(pcVar40,sVar42,1,(FILE *)pfVar32->fp);
  if (8 < *(ushort *)(puVar27 + 5) - 8) goto switchD_00110833_caseD_c;
  pfVar29 = (fb_output_t *)(ulong)(*(uint *)(puVar27 + 0xe) >> 8 & 1);
  switch((uint)*(ushort *)(puVar27 + 5)) {
  case 8:
    pfVar41 = (fb_symbol_t *)puVar27[0x12];
    if (pfVar41 == (fb_symbol_t *)0x0) {
switchD_001108d3_caseD_1:
      pFVar33 = (FILE *)pfVar32->fp;
      pfVar35 = (fb_output_t *)puVar27[0x10];
      uVar21 = puVar27[0x11];
      uVar3 = *(ushort *)((long)puVar27 + 0x72);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = pfVar35->nsc + (pfVar35 == (fb_output_t *)0x0);
      pfStack_420 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / auVar7,0);
      pcVar40 = "flatcc_verify_vector_field(td, %lu, %d, %lu, %u, INT64_C(%lu))";
    }
    else {
      pfStack_428 = (fb_output_t *)0x110851;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar41[1].link,pfVar41,(fb_scoped_name_t *)auStack_330);
      uVar21 = puVar27[0x11];
      pFVar33 = (FILE *)pfVar32->fp;
      if (*(short *)(puVar27[0x12] + 0x10) == 0) {
        pfVar35 = (fb_output_t *)(ulong)*(ushort *)((long)puVar27 + 0x72);
        pfStack_428 = (fb_output_t *)0x110a4d;
        pfVar36 = (fb_output_t *)auStack_330;
        fprintf(pFVar33,"flatcc_verify_table_as_nested_root(td, %lu, %u, 0, %u, %s_verify_table)",
                uVar21,pfVar29);
        break;
      }
      pfVar35 = (fb_output_t *)puVar27[0x10];
      uVar3 = *(ushort *)((long)puVar27 + 0x72);
      pcVar40 = "flatcc_verify_struct_as_nested_root(td, %lu, %u, 0, %lu,  %u)";
    }
    pfVar36 = (fb_output_t *)(ulong)uVar3;
    pfStack_428 = (fb_output_t *)0x11091b;
    fprintf(pFVar33,pcVar40,uVar21,pfVar29);
    break;
  case 9:
switchD_00110833_caseD_9:
    pfVar35 = (fb_output_t *)(ulong)*(ushort *)((long)puVar27 + 0x72);
    pfStack_428 = (fb_output_t *)0x11099d;
    fprintf((FILE *)pfVar32->fp,"flatcc_verify_field(td, %lu, %lu, %u)",puVar27[0x11],puVar27[0x10])
    ;
    break;
  case 10:
    pFVar33 = (FILE *)pfVar32->fp;
    uVar21 = puVar27[0x11];
    pcVar40 = "flatcc_verify_string_vector_field(td, %lu, %d)";
    goto LAB_00110935;
  case 0xb:
    pFVar33 = (FILE *)pfVar32->fp;
    uVar21 = puVar27[0x11];
    pcVar40 = "flatcc_verify_string_field(td, %lu, %d)";
LAB_00110935:
    pfStack_428 = (fb_output_t *)0x11093e;
    fprintf(pFVar33,pcVar40,uVar21,pfVar29);
    break;
  case 0xf:
    pFVar33 = (FILE *)((fb_symbol_t *)puVar27[3])[1].link;
    pfStack_428 = (fb_output_t *)0x110953;
    __flatcc_fb_scoped_symbol_name
              ((fb_scope_t *)pFVar33,(fb_symbol_t *)puVar27[3],(fb_scoped_name_t *)auStack_330);
    switch(*(undefined2 *)(puVar27[3] + 0x10)) {
    case 0:
      pFVar33 = (FILE *)pfVar32->fp;
      uVar21 = puVar27[0x11];
      pcVar40 = "flatcc_verify_table_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_00110833_caseD_9;
    default:
      goto switchD_00110973_caseD_2;
    case 4:
      pFVar33 = (FILE *)pfVar32->fp;
      uVar21 = puVar27[0x11];
      pcVar40 = "flatcc_verify_union_field(td, %lu, %d, &%s_union_verifier)";
    }
    goto LAB_001109f9;
  case 0x10:
    pFVar33 = (FILE *)((fb_symbol_t *)puVar27[3])[1].link;
    pfStack_428 = (fb_output_t *)0x1108b3;
    __flatcc_fb_scoped_symbol_name
              ((fb_scope_t *)pFVar33,(fb_symbol_t *)puVar27[3],(fb_scoped_name_t *)auStack_330);
    switch(*(undefined2 *)(puVar27[3] + 0x10)) {
    case 0:
      pFVar33 = (FILE *)pfVar32->fp;
      uVar21 = puVar27[0x11];
      pcVar40 = "flatcc_verify_table_vector_field(td, %lu, %d, &%s_verify_table)";
      break;
    case 1:
    case 3:
      goto switchD_001108d3_caseD_1;
    default:
      goto switchD_001108d3_caseD_2;
    case 4:
      pFVar33 = (FILE *)pfVar32->fp;
      uVar21 = puVar27[0x11];
      pcVar40 = "flatcc_verify_union_vector_field(td, %lu, %d, &%s_union_verifier)";
    }
LAB_001109f9:
    pfStack_428 = (fb_output_t *)0x110a05;
    pfVar35 = (fb_output_t *)auStack_330;
    fprintf(pFVar33,pcVar40,uVar21,pfVar29);
  }
switchD_00110833_caseD_c:
  pfStack_428 = (fb_output_t *)0x110a24;
  fprintf((FILE *)pfVar32->fp," /* %.*s */",(ulong)*(uint *)((undefined8 *)puVar27[1] + 1),
          *(undefined8 *)puVar27[1]);
  puVar27 = (undefined8 *)*puVar27;
  bVar43 = true;
  if (puVar27 == (undefined8 *)0x0) goto LAB_00110a53;
  goto LAB_001107c1;
code_r0x001107c8:
  puVar27 = (undefined8 *)*puVar27;
  if (puVar27 == (undefined8 *)0x0) goto LAB_00110a4f;
  goto LAB_001107c1;
LAB_00110a4f:
  if (bVar43) {
LAB_00110a53:
    pfStack_428 = (fb_output_t *)0x110a70;
    fwrite(")) return ret;\n",0xf,1,(FILE *)pfVar32->fp);
  }
LAB_00110a70:
  pfStack_428 = (fb_output_t *)0x110a8d;
  fwrite("    return flatcc_verify_ok;\n",0x1d,1,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x110aaa;
  fwrite("}\n\n",3,1,(FILE *)pfVar32->fp);
  pfStack_428 = (fb_output_t *)0x110ac8;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,sn,sn,sn);
  pfStack_428 = (fb_output_t *)0x110ae6;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_identifier, &%s_verify_table);\n}\n\n"
          ,sn,sn,sn);
  pfStack_428 = (fb_output_t *)0x110b04;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_typed_root(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,sn,sn,sn);
  pfStack_428 = (fb_output_t *)0x110b22;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_typed_root_with_size(const void *buf, size_t bufsiz)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, %s_type_identifier, &%s_verify_table);\n}\n\n"
          ,sn,sn,sn);
  pfStack_428 = (fb_output_t *)0x110b3d;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root_with_identifier(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,sn,sn);
  pfStack_428 = (fb_output_t *)0x110b58;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root_with_identifier_and_size(const void *buf, size_t bufsiz, const char *fid)\n{\n    return flatcc_verify_table_as_root_with_size(buf, bufsiz, fid, &%s_verify_table);\n}\n\n"
          ,sn,sn);
  pfStack_428 = (fb_output_t *)0x110b76;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root_with_type_hash(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,sn,pfVar32,sn);
  pfStack_428 = (fb_output_t *)0x110b94;
  pfVar35 = sn;
  fprintf((FILE *)pfVar32->fp,
          "static inline int %s_verify_as_root_with_type_hash_and_size(const void *buf, size_t bufsiz, %sthash_t thash)\n{\n    return flatcc_verify_table_as_typed_root_with_size(buf, bufsiz, thash, &%s_verify_table);\n}\n\n"
          ,sn,pfVar32);
LAB_00110b94:
  pfVar28 = pfVar28->link;
  if (pfVar28 == (fb_symbol_t *)0x0) {
LAB_00110ba0:
    if (pfVar32->opts->cgen_pragmas != 0) {
      pfStack_428 = (fb_output_t *)0x110bcd;
      fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)pfVar32->fp);
    }
    pfStack_428 = (fb_output_t *)0x110bf0;
    fprintf((FILE *)pfVar32->fp,"#endif /* %s_VERIFIER_H */\n",pfVar32->S->basenameup);
    return 0;
  }
  goto LAB_00110761;
switchD_001108d3_caseD_2:
  pfStack_428 = (fb_output_t *)0x110c13;
  __flatcc_fb_gen_c_verifier_cold_3();
switchD_00110973_caseD_2:
  pfStack_428 = (fb_output_t *)__flatcc_fb_gen_c_sorter;
  __flatcc_fb_gen_c_verifier_cold_4();
  pfVar41 = *(fb_symbol_t **)(*(long *)(pFVar33 + 1) + 0x40);
  for (pfVar22 = pfVar41; pfVar22 != (fb_symbol_t *)0x0; pfVar22 = pfVar22->link) {
    if ((pfVar22->kind & 0xfffb) == 0) {
      for (puVar19 = *(undefined8 **)&pfVar22[1].kind; puVar19 != (undefined8 *)0x0;
          puVar19 = (undefined8 *)*puVar19) {
        if ((ushort)((short)*(undefined4 *)(puVar19 + 5) - 0xfU) < 2) {
          *(undefined8 *)(puVar19[3] + 0xd0) = 0;
        }
      }
      pfVar22[8].kind = 0;
      pfVar22[8].flags = 0;
      *(undefined4 *)&pfVar22[8].field_0x14 = 0;
    }
  }
  iVar11 = 0;
  do {
    while (pfStack_450 = pfVar32, puStack_448 = auStack_330, puStack_440 = puVar27,
          pfStack_438 = pfVar28, pfStack_430 = sn, pfStack_428 = pfVar29,
          pfVar41 == (fb_symbol_t *)0x0) {
      bVar43 = iVar11 == 0;
      iVar11 = 0;
      if (bVar43) {
        pcStack_630 = (char *)0x110d3f;
        memset(auStack_620 + 0xe8,0,0xe8);
LAB_00110da9:
        pcStack_630 = (char *)0x110dba;
        fputc(10,*(FILE **)(pFVar33->_unused2 + 0xc));
        pfVar28 = *(fb_symbol_t **)(*(long *)(pFVar33 + 1) + 0x40);
        if (pfVar28 != (fb_symbol_t *)0x0) {
          pfVar1 = (fb_scoped_name_t *)(auStack_620 + 0xe8);
          do {
            if ((pfVar28->kind == 4) && ((pfVar28[8].kind & 3) != 0)) {
              pcStack_630 = (char *)0x110dff;
              memset(pfVar1,0,0xe8);
              pcStack_630 = (char *)0x110e10;
              memset(auStack_620,0,0xe8);
              pcStack_630 = (char *)0x110e1f;
              __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar28[1].link,pfVar28,pfVar1);
              pcStack_630 = (char *)0x110e3d;
              fprintf(*(FILE **)(pFVar33->_unused2 + 0xc),
                      "static void %s_sort(%s_mutable_union_t u)\n{\n    switch (u.type) {\n",pfVar1
                      ,pfVar1);
              for (puVar27 = *(undefined8 **)&pfVar28[1].kind; puVar27 != (undefined8 *)0x0;
                  puVar27 = (undefined8 *)*puVar27) {
                if (*(short *)(puVar27 + 5) == 0xf) {
                  pfVar32 = *(fb_output_t **)puVar27[1];
                  uVar10 = *(uint *)((undefined8 *)puVar27[1] + 1);
                  pcStack_630 = (char *)0x110e6a;
                  __flatcc_fb_scoped_symbol_name
                            ((fb_scope_t *)((fb_symbol_t *)puVar27[3])[1].link,
                             (fb_symbol_t *)puVar27[3],(fb_scoped_name_t *)auStack_620);
                  if ((*(short *)(puVar27[3] + 0x10) == 0) &&
                     ((*(byte *)(puVar27[3] + 0xd0) & 3) != 0)) {
                    pfVar36 = (fb_output_t *)auStack_620;
                    pcStack_630 = (char *)0x110ea1;
                    fprintf(*(FILE **)(pFVar33->_unused2 + 0xc),
                            "    case %s_%.*s: %s_sort(u.value); break;\n",pfVar1,(ulong)uVar10);
                    pfVar35 = pfVar32;
                  }
                }
              }
              pcStack_630 = (char *)0x110ec6;
              fwrite("    default: break;\n    }\n}\n\n",0x1d,1,*(FILE **)(pFVar33->_unused2 + 0xc))
              ;
            }
            pfVar28 = pfVar28->link;
          } while (pfVar28 != (fb_symbol_t *)0x0);
          pfVar28 = *(fb_symbol_t **)(*(long *)(pFVar33 + 1) + 0x40);
          if (pfVar28 != (fb_symbol_t *)0x0) {
            pfVar1 = (fb_scoped_name_t *)(auStack_620 + 0xe8);
            do {
              if ((pfVar28->kind == 0) && ((pfVar28[8].kind & 3) != 0)) {
                pcStack_630 = (char *)0x110f17;
                memset(pfVar1,0,0xe8);
                pcStack_630 = (char *)0x110f28;
                memset(auStack_620,0,0xe8);
                pcStack_630 = (char *)0x110f37;
                __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar28[1].link,pfVar28,pfVar1);
                pcStack_630 = (char *)0x110f52;
                fprintf(*(FILE **)(pFVar33->_unused2 + 0xc),
                        "static void %s_sort(%s_mutable_table_t t)\n{\n",pfVar1,pfVar1);
                pcVar40 = "    if (!t) return;\n";
                pcStack_630 = (char *)0x110f6f;
                fwrite("    if (!t) return;\n",0x14,1,*(FILE **)(pFVar33->_unused2 + 0xc));
                if (((pfVar28[8].kind & 1) != 0) &&
                   (plVar37 = *(long **)&pfVar28[1].kind, plVar37 != (long *)0x0)) {
                  do {
                    if ((*(byte *)(plVar37 + 0xe) & 4) == 0) {
                      pfVar32 = *(fb_output_t **)plVar37[1];
                      uVar10 = *(uint *)((undefined8 *)plVar37[1] + 1);
                      if ((short)plVar37[5] == 0x10) {
                        pcVar40 = (char *)((fb_symbol_t *)plVar37[3])[1].link;
                        pcStack_630 = (char *)0x111004;
                        __flatcc_fb_scoped_symbol_name
                                  ((fb_scope_t *)pcVar40,(fb_symbol_t *)plVar37[3],
                                   (fb_scoped_name_t *)auStack_620);
                        lVar38 = plVar37[3];
                        if (*(short *)(lVar38 + 0x10) == 4) {
                          bVar2 = *(byte *)(lVar38 + 0xd0);
                          pcVar31 = "    __%ssort_union_vector_field_elements(%s, %.*s, %s, t);\n";
                        }
                        else {
                          if (*(short *)(lVar38 + 0x10) != 0) goto LAB_0011104f;
                          bVar2 = *(byte *)(lVar38 + 0xd0);
                          pcVar31 = "    __%ssort_table_vector_field_elements(%s, %.*s, %s, t);\n";
                        }
                      }
                      else {
                        if ((short)plVar37[5] != 0xf) goto LAB_0011104f;
                        pcVar40 = (char *)((fb_symbol_t *)plVar37[3])[1].link;
                        pcStack_630 = (char *)0x110fc9;
                        __flatcc_fb_scoped_symbol_name
                                  ((fb_scope_t *)pcVar40,(fb_symbol_t *)plVar37[3],
                                   (fb_scoped_name_t *)auStack_620);
                        lVar38 = plVar37[3];
                        if (*(short *)(lVar38 + 0x10) == 4) {
                          bVar2 = *(byte *)(lVar38 + 0xd0);
                          pcVar31 = "    __%ssort_union_field(%s, %.*s, %s, t);\n";
                        }
                        else {
                          if (*(short *)(lVar38 + 0x10) != 0) goto LAB_0011104f;
                          bVar2 = *(byte *)(lVar38 + 0xd0);
                          pcVar31 = "    __%ssort_table_field(%s, %.*s, %s, t);\n";
                        }
                      }
                      if ((bVar2 & 3) != 0) {
                        pcVar40 = *(char **)(pFVar33->_unused2 + 0xc);
                        pfVar35 = (fb_output_t *)(ulong)uVar10;
                        pFStack_638 = (FILE *)auStack_620;
                        pfStack_640 = (fb_scoped_name_t *)0x11104b;
                        fprintf((FILE *)pcVar40,pcVar31,pFVar33,pfVar1);
                        pfVar36 = pfVar32;
                      }
                    }
LAB_0011104f:
                    plVar37 = (long *)*plVar37;
                  } while (plVar37 != (long *)0x0);
                  if ((pfVar28[8].kind & 1) != 0) {
                    for (puVar27 = *(undefined8 **)&pfVar28[1].kind; puVar27 != (undefined8 *)0x0;
                        puVar27 = (undefined8 *)*puVar27) {
                      if ((*(byte *)((long)puVar27 + 0x71) & 0x20) != 0) {
                        pfVar32 = *(fb_output_t **)puVar27[1];
                        uVar10 = *(uint *)((undefined8 *)puVar27[1] + 1);
                        sVar5 = *(short *)(puVar27 + 5);
                        if (sVar5 == 0x10) {
                          pfVar41 = (fb_symbol_t *)puVar27[3];
                          if (pfVar41[2].ident == (fb_token_t *)0x0) {
LAB_001111d1:
                            pcStack_630 = (char *)0x1111d6;
                            __flatcc_fb_gen_c_sorter_cold_1();
                            pcStack_858 = (code *)0x111208;
                            pFStack_658 = pFVar33;
                            puStack_650 = puVar27;
                            pfStack_648 = pfVar32;
                            pfStack_640 = pfVar1;
                            pFStack_638 = (FILE *)pfVar28;
                            pcStack_630 = (char *)(ulong)uVar10;
                            println((fb_output_t *)pcVar40,"#ifndef %s_JSON_PARSER_H",
                                    ((fb_output_t *)pcVar40)->S->basenameup);
                            pcStack_858 = (code *)0x111227;
                            println((fb_output_t *)pcVar40,"#define %s_JSON_PARSER_H",
                                    ((fb_output_t *)pcVar40)->S->basenameup);
                            pcStack_858 = (code *)0x11123b;
                            println((fb_output_t *)pcVar40,"");
                            pcStack_858 = (code *)0x11124c;
                            println((fb_output_t *)pcVar40,
                                    "/* Generated by flatcc 0.6.2 FlatBuffers schema compiler for C by dvide.com */"
                                   );
                            pcStack_858 = (code *)0x111259;
                            println((fb_output_t *)pcVar40,"");
                            pcStack_858 = (code *)0x11126a;
                            println((fb_output_t *)pcVar40,
                                    "#include \"flatcc/flatcc_json_parser.h\"");
                            pcStack_858 = (code *)0x111280;
                            __flatcc_fb_gen_c_includes
                                      ((fb_output_t *)pcVar40,"_json_parser.h","_JSON_PARSER_H");
                            if (((fb_output_t *)pcVar40)->opts->cgen_pragmas != 0) {
                              pcStack_858 = (code *)0x1112ad;
                              fwrite("#include \"flatcc/flatcc_prologue.h\"\n",0x24,1,
                                     (FILE *)((fb_output_t *)pcVar40)->fp);
                            }
                            pcStack_858 = (code *)0x1112be;
                            println((fb_output_t *)pcVar40,"");
                            pfVar13 = ((fb_output_t *)pcVar40)->S;
                            pfVar28 = (pfVar13->root_type).type;
                            pcStack_858 = (code *)0x1112dd;
                            memset(auStack_740,0,0xe8);
                            if ((pfVar28 != (fb_symbol_t *)0x0) && (pfVar28->kind < 2)) {
                              pcStack_858 = (code *)0x111303;
                              println((fb_output_t *)pcVar40,"/*");
                              pcStack_858 = (code *)0x111314;
                              println((fb_output_t *)pcVar40,
                                      " * Parses the default root table or struct of the schema and constructs a FlatBuffer."
                                     );
                              pcStack_858 = (code *)0x111325;
                              println((fb_output_t *)pcVar40," *");
                              pcStack_858 = (code *)0x111336;
                              println((fb_output_t *)pcVar40,
                                      " * Builder `B` must be initialized. `ctx` can be null but will hold"
                                     );
                              pcStack_858 = (code *)0x111347;
                              println((fb_output_t *)pcVar40,
                                      " * hold detailed error info on return when available.");
                              pcStack_858 = (code *)0x111358;
                              println((fb_output_t *)pcVar40,
                                      " * Returns 0 on success, or error code.");
                              pcStack_858 = (code *)0x111369;
                              println((fb_output_t *)pcVar40,
                                      " * `flags` : 0 by default, `flatcc_json_parser_f_skip_unknown` silently"
                                     );
                              pcStack_858 = (code *)0x11137a;
                              println((fb_output_t *)pcVar40,
                                      " * ignores unknown table and structs fields, and union types."
                                     );
                              pcStack_858 = (code *)0x11138b;
                              println((fb_output_t *)pcVar40," */");
                              pcStack_858 = (code *)0x1113aa;
                              println((fb_output_t *)pcVar40,
                                      "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,"
                                      ,((fb_output_t *)pcVar40)->S->basename);
                              ((fb_output_t *)pcVar40)->indent =
                                   ((fb_output_t *)pcVar40)->indent + 2;
                              pcStack_858 = (code *)0x1113c2;
                              println((fb_output_t *)pcVar40,
                                      "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags);"
                                     );
                              iVar11 = ((fb_output_t *)pcVar40)->indent;
                              if ((iVar11 == 0) ||
                                 (((fb_output_t *)pcVar40)->indent = iVar11 + -1, iVar11 + -1 == 0))
                              {
                                pcStack_858 = (code *)0x113012;
                                __assert_fail("out->indent",
                                              "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                              ,0x6e9,"int gen_json_parser_prototypes(fb_output_t *)"
                                             );
                              }
                              ((fb_output_t *)pcVar40)->indent = iVar11 + -2;
                              pcStack_858 = (code *)0x1113fa;
                              println((fb_output_t *)pcVar40,"");
                              pfVar13 = ((fb_output_t *)pcVar40)->S;
                            }
                            pfVar28 = pfVar13->symbols;
                            if (pfVar28 == (fb_symbol_t *)0x0) goto LAB_0011158c;
                            goto LAB_0011142b;
                          }
                          pcVar40 = (char *)pfVar41[1].link;
                          pcStack_630 = (char *)0x111183;
                          __flatcc_fb_scoped_symbol_name
                                    ((fb_scope_t *)pcVar40,pfVar41,(fb_scoped_name_t *)auStack_620);
                          if (1 < *(ushort *)(puVar27[3] + 0x10)) goto LAB_00111160;
                          pcVar40 = *(char **)(pFVar33->_unused2 + 0xc);
                          pcVar31 = "    __%ssort_vector_field(%s, %.*s, %s, t)\n";
                          pFStack_638 = (FILE *)auStack_620;
                        }
                        else {
                          if (sVar5 == 10) {
                            pcVar40 = *(char **)(pFVar33->_unused2 + 0xc);
                            pcStack_630 = "string";
                          }
                          else {
                            if (sVar5 != 8) goto LAB_00111160;
                            if (0xb < *(int *)(puVar27 + 3) - 1U) {
                              pcStack_630 = (char *)0x1111d1;
                              __flatcc_fb_gen_c_sorter_cold_2();
                              goto LAB_001111d1;
                            }
                            pcStack_630 = &DAT_001418f0 +
                                          *(int *)(&DAT_001418f0 +
                                                  (ulong)(*(int *)(puVar27 + 3) - 1U) * 4);
                            pcVar40 = *(char **)(pFVar33->_unused2 + 0xc);
                          }
                          pcVar31 = "    __%ssort_vector_field(%s, %.*s, %s%s, t)\n";
                          pFStack_638 = pFVar33;
                        }
                        pfVar35 = (fb_output_t *)(ulong)uVar10;
                        pfStack_640 = (fb_scoped_name_t *)0x11115c;
                        fprintf((FILE *)pcVar40,pcVar31,pFVar33,pfVar1);
                        pfVar36 = pfVar32;
                      }
LAB_00111160:
                    }
                  }
                }
                pcStack_630 = (char *)0x1110a9;
                fwrite("}\n\n",3,1,*(FILE **)(pFVar33->_unused2 + 0xc));
              }
              pfVar28 = pfVar28->link;
            } while (pfVar28 != (fb_symbol_t *)0x0);
          }
        }
        return 0;
      }
    }
    iVar18 = 0;
    pfVar22 = pfVar41;
    do {
      if ((pfVar22->kind & 0xfffb) == 0) {
        for (puVar19 = *(undefined8 **)&pfVar22[1].kind; puVar19 != (undefined8 *)0x0;
            puVar19 = (undefined8 *)*puVar19) {
          if ((*(ushort *)(puVar19 + 0xe) & 4) == 0) {
            if ((*(ushort *)(puVar19 + 0xe) >> 0xd & 1) != 0) {
              *(byte *)&pfVar22[8].kind = (byte)pfVar22[8].kind | 1;
            }
            if ((*(short *)(puVar19 + 5) == 0x10) || (*(short *)(puVar19 + 5) == 0xf)) {
              uVar3 = *(ushort *)(puVar19[3] + 0x10);
              pfVar35 = (fb_output_t *)(ulong)uVar3;
              if (((uVar3 & 0xfffb) == 0) && ((*(byte *)(puVar19[3] + 0xd0) & 3) != 0)) {
                *(byte *)&pfVar22[8].kind = (byte)pfVar22[8].kind | 1;
              }
            }
          }
        }
        iVar18 = (iVar18 + 1) - (uint)((pfVar22[8].kind & 3) == 0);
      }
      pfVar22 = pfVar22->link;
    } while (pfVar22 != (fb_symbol_t *)0x0);
    bVar43 = iVar11 != iVar18;
    iVar11 = iVar18;
  } while (bVar43);
  pcStack_630 = (char *)0x110d55;
  memset(auStack_620 + 0xe8,0,0xe8);
  if (pfVar41 != (fb_symbol_t *)0x0) {
    pfVar1 = (fb_scoped_name_t *)(auStack_620 + 0xe8);
    do {
      if ((pfVar41->kind == 0) && ((pfVar41[8].kind & 3) != 0)) {
        pcStack_630 = (char *)0x110d8a;
        __flatcc_fb_scoped_symbol_name((fb_scope_t *)pfVar41[1].link,pfVar41,pfVar1);
        pcStack_630 = (char *)0x110da1;
        fprintf(*(FILE **)(pFVar33->_unused2 + 0xc),"static void %s_sort(%s_mutable_table_t t);\n",
                pfVar1,pfVar1);
      }
      pfVar41 = pfVar41->link;
    } while (pfVar41 != (fb_symbol_t *)0x0);
  }
  goto LAB_00110da9;
LAB_0011142b:
  do {
    switch(pfVar28->kind) {
    case 0:
      pcStack_858 = (code *)0x111453;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
      pcVar31 = 
      "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    case 1:
      pcStack_858 = (code *)0x1114ca;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
      pcStack_858 = (code *)0x1114de;
      println((fb_output_t *)pcVar40,
              "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base);"
              ,(fb_scoped_name_t *)auStack_740);
      pcVar31 = 
      "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result);"
      ;
      break;
    default:
      goto switchD_00111442_caseD_2;
    case 3:
      pcStack_858 = (code *)0x111471;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
      pcStack_858 = (code *)0x111481;
      println((fb_output_t *)pcVar40,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_740);
      ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
      pcStack_858 = (code *)0x111498;
      println((fb_output_t *)pcVar40,"int *value_type, uint64_t *value, int *aggregate);",
              (fb_scoped_name_t *)auStack_740);
      iVar11 = ((fb_output_t *)pcVar40)->indent;
      if ((iVar11 == 0) || (((fb_output_t *)pcVar40)->indent = iVar11 + -1, iVar11 + -1 == 0)) {
LAB_00112d20:
        pcStack_858 = (code *)0x112d3f;
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x709,"int gen_json_parser_prototypes(fb_output_t *)");
      }
      goto LAB_00111570;
    case 4:
      pcStack_858 = (code *)0x111506;
      __flatcc_fb_scoped_symbol_name
                ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
      pcStack_858 = (code *)0x11151a;
      println((fb_output_t *)pcVar40,
              "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *pref);"
              ,(fb_scoped_name_t *)auStack_740);
      pcStack_858 = (code *)0x11152e;
      println((fb_output_t *)pcVar40,"static int %s_json_union_accept_type(uint8_t type);",
              (fb_scoped_name_t *)auStack_740);
      pcStack_858 = (code *)0x11153e;
      println((fb_output_t *)pcVar40,
              "static const char *%s_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
              ,(fb_scoped_name_t *)auStack_740);
      ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
      pcStack_858 = (code *)0x111552;
      println((fb_output_t *)pcVar40,"int *value_type, uint64_t *value, int *aggregate);");
      iVar11 = ((fb_output_t *)pcVar40)->indent;
      if ((iVar11 == 0) || (((fb_output_t *)pcVar40)->indent = iVar11 + -1, iVar11 + -1 == 0)) {
        pcStack_858 = (code *)0x112d5e;
        __assert_fail("out->indent",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                      ,0x6f9,"int gen_json_parser_prototypes(fb_output_t *)");
      }
LAB_00111570:
      ((fb_output_t *)pcVar40)->indent = iVar11 + -2;
      goto switchD_00111442_caseD_2;
    }
    pcStack_858 = (code *)0x1114f2;
    println((fb_output_t *)pcVar40,pcVar31,(fb_scoped_name_t *)auStack_740);
switchD_00111442_caseD_2:
    pfVar28 = pfVar28->link;
  } while (pfVar28 != (fb_symbol_t *)0x0);
  pfVar13 = ((fb_output_t *)pcVar40)->S;
LAB_0011158c:
  pcStack_858 = (code *)0x11159f;
  fb_scope_table_visit(&pfVar13->root_schema->scope_index,gen_local_scope_prototype,pcVar40);
  pcStack_858 = (code *)0x1115be;
  println((fb_output_t *)pcVar40,
          "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
          ,((fb_output_t *)pcVar40)->S->basename);
  ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
  pcStack_858 = (code *)0x1115d6;
  println((fb_output_t *)pcVar40,"int *value_type, uint64_t *value, int *aggregate);");
  iVar11 = ((fb_output_t *)pcVar40)->indent;
  if (iVar11 != 0) {
    uVar10 = iVar11 - 1;
    pcVar20 = (code *)(ulong)uVar10;
    ((fb_output_t *)pcVar40)->indent = uVar10;
    if (uVar10 != 0) {
      ((fb_output_t *)pcVar40)->indent = iVar11 + -2;
      pcStack_858 = (code *)0x11160e;
      println((fb_output_t *)pcVar40,"");
      pfVar13 = ((fb_output_t *)pcVar40)->S;
      ct_00 = (fb_compound_type_t *)pfVar13->symbols;
      if (ct_00 != (fb_compound_type_t *)0x0) {
        do {
          switch((ct_00->symbol).kind) {
          case 0:
            uStack_808._0_4_ = 0;
            uStack_808._4_4_ = 0;
            if ((ct_00->symbol).kind != 0) {
LAB_00112d82:
              pcStack_858 = (code *)0x112da1;
              __assert_fail("ct->symbol.kind == fb_is_table",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5a3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_858 = (code *)0x111672;
            auStack_830 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_848);
            uVar10 = uStack_848;
            if (0 < (int)uStack_848 && auStack_830 == (undefined1  [8])0x0) {
              pcStack_858 = (code *)0x112e03;
              __flatcc_fb_gen_c_json_parser_cold_1();
              goto LAB_00112e03;
            }
            uVar12 = (ulong)uStack_848;
            pgStack_828 = gen_field_match;
            pcVar20 = gen_field_unmatched;
            pgStack_820 = gen_field_unmatched;
            if ((int)uStack_848 < 1) {
              uVar39 = 0;
            }
            else {
              pcVar20 = (code *)(uVar12 << 5);
              pcVar23 = (code *)0x0;
              uVar39 = 0;
              do {
                uVar39 = (uVar39 + 1) -
                         (uint)(*(int *)((long)&((dict_entry_t *)auStack_830)->hint + (long)pcVar23)
                               == 0);
                pcVar23 = pcVar23 + 0x20;
              } while (pcVar20 != pcVar23);
            }
            uStack_810 = (ulong)uVar39 << 0x20;
            pcStack_858 = (code *)0x111d24;
            pfStack_818 = ct_00;
            memset((fb_scoped_name_t *)auStack_740,0,0xe8);
            pcStack_858 = (code *)0x111d33;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x111d47;
            println((fb_output_t *)pcVar40,
                    "static const char *%s_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x111d58;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111d6f;
            println((fb_output_t *)pcVar40,"int more;");
            if (0 < (int)uVar10) {
              pcStack_858 = (code *)0x111d85;
              println((fb_output_t *)pcVar40,"void *pval;");
              pcStack_858 = (code *)0x111d96;
              println((fb_output_t *)pcVar40,"flatcc_builder_ref_t ref, *pref;");
              pcStack_858 = (code *)0x111da7;
              println((fb_output_t *)pcVar40,"const char *mark;");
              pcStack_858 = (code *)0x111db8;
              println((fb_output_t *)pcVar40,"uint64_t w;");
            }
            if (uVar39 == 0) {
              pcStack_858 = (code *)0x111e2b;
              println((fb_output_t *)pcVar40,"");
              pcStack_858 = (code *)0x111e3c;
              println((fb_output_t *)pcVar40,"*result = 0;");
              uVar24 = ct_00->count;
              pcVar31 = "if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;";
            }
            else {
              pcStack_858 = (code *)0x111dd4;
              println((fb_output_t *)pcVar40,"size_t h_unions;");
              pcStack_858 = (code *)0x111de5;
              println((fb_output_t *)pcVar40,"");
              pcStack_858 = (code *)0x111df6;
              println((fb_output_t *)pcVar40,"*result = 0;");
              pcStack_858 = (code *)0x111e0e;
              println((fb_output_t *)pcVar40,
                      "if (flatcc_builder_start_table(ctx->ctx, %lu)) goto failed;",ct_00->count);
              uVar24 = (uint64_t)(int)uVar39;
              pcVar31 = 
              "if (end == flatcc_json_parser_prepare_unions(ctx, buf, end, %lu, &h_unions)) goto failed;"
              ;
            }
            pcStack_858 = (code *)0x111e54;
            println((fb_output_t *)pcVar40,pcVar31,uVar24);
            pcStack_858 = (code *)0x111e65;
            println((fb_output_t *)pcVar40,
                    "buf = flatcc_json_parser_object_start(ctx, buf, end, &more);");
            pcStack_858 = (code *)0x111e76;
            println((fb_output_t *)pcVar40,"while (more) {");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111e8d;
            println((fb_output_t *)pcVar40,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);");
            if ((int)uVar10 < 1) {
              pcStack_858 = (code *)0x111ec9;
              println((fb_output_t *)pcVar40,"/* Table has no fields. */");
              pcStack_858 = (code *)0x111eda;
              println((fb_output_t *)pcVar40,
                      "buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
            }
            else {
              pcStack_858 = (code *)0x111ea3;
              println((fb_output_t *)pcVar40,"w = flatcc_json_parser_symbol_part(buf, end);");
              pcVar20 = (code *)(ulong)(uVar10 - 1);
              pfVar35 = (fb_output_t *)0x0;
              pcStack_858 = (code *)0x111eb9;
              gen_trie((fb_output_t *)pcVar40,(trie_t *)auStack_830,0,uVar10 - 1,0);
            }
            pcStack_858 = (code *)0x111eeb;
            println((fb_output_t *)pcVar40,
                    "buf = flatcc_json_parser_object_end(ctx, buf, end, &more);");
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112dfe;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5d3,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111f12;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x111f23;
            println((fb_output_t *)pcVar40,"if (ctx->error) goto failed;");
            if (0 < (int)uVar10) {
              bVar43 = true;
              lVar38 = 0;
              do {
                lVar6 = *(long *)((long)((long)auStack_830 + 0x10) + lVar38);
                uVar3 = *(ushort *)(lVar6 + 0x70);
                pcVar20 = (code *)(ulong)uVar3;
                if ((uVar3 & 4) == 0) {
                  if ((ushort)((short)*(undefined4 *)(lVar6 + 0x28) - 0xfU) < 2) {
                    lVar25 = -(ulong)(*(short *)(*(long *)(lVar6 + 0x18) + 0x10) == 4);
                  }
                  else {
                    lVar25 = 0;
                  }
                  if ((uVar3 >> 8 & 1) != 0) {
                    lVar25 = lVar25 + *(long *)(lVar6 + 0x88);
                    if (bVar43) {
                      bVar43 = false;
                      pcStack_858 = (code *)0x111fa1;
                      println((fb_output_t *)pcVar40,
                              "if (!flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar25);
                      ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
                    }
                    else {
                      bVar43 = false;
                      pcStack_858 = (code *)0x111f8c;
                      println((fb_output_t *)pcVar40,
                              "||  !flatcc_builder_check_required_field(ctx->ctx, %lu)",lVar25);
                    }
                  }
                }
                lVar38 = lVar38 + 0x20;
              } while (uVar12 << 5 != lVar38);
              if (!bVar43) {
                if (((fb_output_t *)pcVar40)->indent == 0) {
                  pcStack_858 = (code *)0x112ff3;
                  __assert_fail("out->indent",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                ,0x5e7,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
                }
                ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
                pcStack_858 = (code *)0x111fe2;
                println((fb_output_t *)pcVar40,") {");
                ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
                pcStack_858 = (code *)0x111ff9;
                println((fb_output_t *)pcVar40,
                        "buf = flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_required);"
                       );
                pcStack_858 = (code *)0x11200a;
                println((fb_output_t *)pcVar40,"goto failed;");
                if (((fb_output_t *)pcVar40)->indent == 0) {
                  pcStack_858 = (code *)0x112fd4;
                  __assert_fail("out->indent",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                ,0x5ea,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
                }
                ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
                pcStack_858 = (code *)0x112031;
                println((fb_output_t *)pcVar40,"}");
              }
            }
            if (uStack_810._4_4_ != 0) {
              pcStack_858 = (code *)0x112049;
              println((fb_output_t *)pcVar40,
                      "buf = flatcc_json_parser_finalize_unions(ctx, buf, end, h_unions);");
            }
            pcStack_858 = (code *)0x11205d;
            println((fb_output_t *)pcVar40,
                    "if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;");
            pcStack_858 = (code *)0x11206e;
            println((fb_output_t *)pcVar40,"return buf;");
            ((fb_output_t *)pcVar40)->tmp_indent = ((fb_output_t *)pcVar40)->indent;
            ((fb_output_t *)pcVar40)->indent = 0;
            pcStack_858 = (code *)0x112095;
            println((fb_output_t *)pcVar40,"failed:");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->tmp_indent;
            pcStack_858 = (code *)0x1120b2;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112ddf;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5f6,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x1120dc;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x1120f0;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x11210c;
            println((fb_output_t *)pcVar40,
                    "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
                    ,auStack_740);
            pcStack_858 = (code *)0x11211d;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x112137;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_table_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_table);"
                    ,auStack_740);
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112dc0;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x5fc,"int gen_table_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x11215a;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x112167;
            println((fb_output_t *)pcVar40,"");
            if (auStack_830 != (undefined1  [8])0x0) {
              pcStack_858 = (code *)0x112179;
              free((void *)auStack_830);
            }
            break;
          case 1:
            uStack_810 = 0;
            uStack_808._0_4_ = 0;
            uStack_808._4_4_ = 0;
            if ((ct_00->symbol).kind != 1) {
              pcStack_858 = (code *)0x112e41;
              __assert_fail("ct->symbol.kind == fb_is_struct",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x54a,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_858 = (code *)0x111721;
            auStack_830 = (undefined1  [8])build_compound_dict(ct_00,(int *)&uStack_848);
            uVar10 = uStack_848;
            if (0 < (int)uStack_848 && auStack_830 == (undefined1  [8])0x0) {
              pcStack_858 = (code *)0x112d82;
              __flatcc_fb_gen_c_json_parser_cold_2();
              goto LAB_00112d82;
            }
            uStack_810 = CONCAT44(uStack_810._4_4_,1);
            pgStack_828 = gen_field_match;
            pgStack_820 = gen_field_unmatched;
            pcStack_858 = (code *)0x111776;
            pfStack_818 = ct_00;
            memset((fb_scoped_name_t *)auStack_740,0,0xe8);
            pcStack_858 = (code *)0x111785;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x111799;
            println((fb_output_t *)pcVar40,
                    "static const char *%s_parse_json_struct_inline(flatcc_json_parser_t *ctx, const char *buf, const char *end, void *struct_base)"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x1117aa;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x1117c1;
            println((fb_output_t *)pcVar40,"int more;");
            if (0 < (int)uVar10) {
              pcStack_858 = (code *)0x1117d7;
              println((fb_output_t *)pcVar40,"flatcc_builder_ref_t ref;");
              pcStack_858 = (code *)0x1117e8;
              println((fb_output_t *)pcVar40,"void *pval;");
              pcStack_858 = (code *)0x1117f9;
              println((fb_output_t *)pcVar40,"const char *mark;");
              pcStack_858 = (code *)0x11180a;
              println((fb_output_t *)pcVar40,"uint64_t w;");
            }
            pcStack_858 = (code *)0x11181b;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x11182c;
            println((fb_output_t *)pcVar40,
                    "buf = flatcc_json_parser_object_start(ctx, buf, end, &more);");
            pcStack_858 = (code *)0x11183d;
            println((fb_output_t *)pcVar40,"while (more) {");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            if (uVar10 == 0) {
              pcStack_858 = (code *)0x11219b;
              println((fb_output_t *)pcVar40,"/* Empty struct. */");
              pcStack_858 = (code *)0x1121ac;
              println((fb_output_t *)pcVar40,
                      "buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);");
            }
            else {
              pcStack_858 = (code *)0x11185d;
              println((fb_output_t *)pcVar40,"buf = flatcc_json_parser_symbol_start(ctx, buf, end);"
                     );
              pcStack_858 = (code *)0x11186e;
              println((fb_output_t *)pcVar40,"w = flatcc_json_parser_symbol_part(buf, end);");
              pfVar35 = (fb_output_t *)0x0;
              pcStack_858 = (code *)0x111884;
              gen_trie((fb_output_t *)pcVar40,(trie_t *)auStack_830,0,uVar10 - 1,0);
            }
            pcStack_858 = (code *)0x1121bd;
            println((fb_output_t *)pcVar40,
                    "buf = flatcc_json_parser_object_end(ctx, buf, end , &more);");
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112d7d;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x56b,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x1121e4;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x1121f5;
            println((fb_output_t *)pcVar40,"return buf;");
            if (0 < (int)uVar10) {
              ((fb_output_t *)pcVar40)->tmp_indent = ((fb_output_t *)pcVar40)->indent;
              ((fb_output_t *)pcVar40)->indent = 0;
              pcStack_858 = (code *)0x112221;
              println((fb_output_t *)pcVar40,"failed:");
              ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->tmp_indent;
              pcStack_858 = (code *)0x11223e;
              println((fb_output_t *)pcVar40,
                      "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                     );
            }
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112ebd;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x574,
                            "int gen_struct_parser_inline(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x112265;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x112276;
            println((fb_output_t *)pcVar40,"");
            if (auStack_830 != (undefined1  [8])0x0) {
              pcStack_858 = (code *)0x112285;
              free((void *)auStack_830);
            }
            if ((ct_00->symbol).kind != 1) {
              pcStack_858 = (code *)0x112e60;
              __assert_fail("ct->symbol.kind == fb_is_struct",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x57e,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            pcStack_858 = (code *)0x1122a0;
            memset((fb_scoped_name_t *)auStack_740,0,0xe8);
            pcStack_858 = (code *)0x1122af;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x1122c3;
            println((fb_output_t *)pcVar40,
                    "static const char *%s_parse_json_struct(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x1122d7;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x1122ee;
            println((fb_output_t *)pcVar40,"void *pval;");
            pcStack_858 = (code *)0x112302;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x112313;
            println((fb_output_t *)pcVar40,"*result = 0;");
            pcVar20 = (code *)(ulong)ct_00->align;
            pcStack_858 = (code *)0x112333;
            println((fb_output_t *)pcVar40,
                    "if (!(pval = flatcc_builder_start_struct(ctx->ctx, %lu, %u))) goto failed;",
                    ct_00->size,pcVar20);
            pcStack_858 = (code *)0x112347;
            println((fb_output_t *)pcVar40,"buf = %s_parse_json_struct_inline(ctx, buf, end, pval);"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x112358;
            println((fb_output_t *)pcVar40,
                    "if (ctx->error || !(*result = flatcc_builder_end_struct(ctx->ctx))) goto failed;"
                   );
            pcStack_858 = (code *)0x112369;
            println((fb_output_t *)pcVar40,"return buf;");
            ((fb_output_t *)pcVar40)->tmp_indent = ((fb_output_t *)pcVar40)->indent;
            ((fb_output_t *)pcVar40)->indent = 0;
            pcStack_858 = (code *)0x112390;
            println((fb_output_t *)pcVar40,"failed:");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->tmp_indent;
            pcStack_858 = (code *)0x1123ad;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112e9e;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x58f,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x1123da;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x1123e7;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x1123fb;
            println((fb_output_t *)pcVar40,
                    "static inline int %s_parse_json_as_root(flatcc_builder_t *B, flatcc_json_parser_t *ctx, const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags, const char *fid)"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x112408;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x112422;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_struct_as_root(B, ctx, buf, bufsiz, flags, fid, %s_parse_json_struct);"
                    ,(fb_scoped_name_t *)auStack_740);
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112e7f;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x595,"int gen_struct_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x112445;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x112452;
            println((fb_output_t *)pcVar40,"");
            break;
          case 3:
            pcStack_858 = (code *)0x1116f1;
            gen_enum_parser((fb_output_t *)pcVar40,ct_00);
            break;
          case 4:
            pcStack_858 = (code *)0x111898;
            memset((fb_scoped_name_t *)auStack_740,0,0xe8);
            pcStack_858 = (code *)0x1118a9;
            memset(auStack_830,0,0xe8);
            pcStack_858 = (code *)0x1118b8;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x1118cc;
            println((fb_output_t *)pcVar40,
                    "static const char *%s_parse_json_union(flatcc_json_parser_t *ctx, const char *buf, const char *end, uint8_t type, flatcc_builder_ref_t *result)"
                    ,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x1118dd;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x1118f0;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x111901;
            println((fb_output_t *)pcVar40,"*result = 0;");
            pcStack_858 = (code *)0x111912;
            println((fb_output_t *)pcVar40,"switch (type) {");
            pcStack_858 = (code *)0x111923;
            println((fb_output_t *)pcVar40,"case 0: /* NONE */");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x11193a;
            println((fb_output_t *)pcVar40,"return flatcc_json_parser_none(ctx, buf, end);");
            if (((fb_output_t *)pcVar40)->indent == 0) {
LAB_00112e03:
              pcStack_858 = (code *)0x112e22;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x614,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            for (pfVar28 = ct_00->members; pfVar28 != (fb_symbol_t *)0x0; pfVar28 = pfVar28->link) {
              uVar4 = pfVar28[1].kind;
              if (uVar4 != 0) {
                pfVar35 = (fb_output_t *)pfVar28->ident->text;
                uVar10 = (uint)pfVar28->ident->len;
                if (uVar4 == 0xb) {
                  pcStack_858 = (code *)0x111a24;
                  println((fb_output_t *)pcVar40,"case %u: /* %.*s */",
                          (ulong)*(uint *)&pfVar28[3].link,(ulong)uVar10);
                  ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
                  pcStack_858 = (code *)0x111a3b;
                  println((fb_output_t *)pcVar40,
                          "buf = flatcc_json_parser_build_string(ctx, buf, end, result);");
                  pcStack_858 = (code *)0x111a4c;
                  println((fb_output_t *)pcVar40,"break;");
                  iVar11 = ((fb_output_t *)pcVar40)->indent;
                  if (iVar11 == 0) {
                    pcStack_858 = (code *)0x112d1b;
                    __assert_fail("out->indent",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                  ,0x631,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)"
                                 );
                  }
                }
                else {
                  if (uVar4 != 0xf) {
                    pcStack_858 = (code *)0x112cdd;
                    __flatcc_fb_gen_c_json_parser_cold_4();
LAB_00112cdd:
                    pcStack_858 = (code *)0x112cfc;
                    __assert_fail("out->indent",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                                  ,0x62b,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)"
                                 );
                  }
                  pcStack_858 = (code *)0x111998;
                  __flatcc_fb_scoped_symbol_name
                            ((fb_scope_t *)pfVar28[1].link[1].link,pfVar28[1].link,
                             (fb_scoped_name_t *)auStack_830);
                  pcStack_858 = (code *)0x1119b2;
                  println((fb_output_t *)pcVar40,"case %u: /* %.*s */",
                          (ulong)*(uint *)&pfVar28[3].link,(ulong)uVar10);
                  ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
                  uVar4 = (pfVar28[1].link)->kind;
                  pcVar31 = "buf = %s_parse_json_table(ctx, buf, end, result);";
                  if (uVar4 != 0) {
                    if (uVar4 != 1) {
                      pcStack_858 = (code *)0x112d20;
                      __flatcc_fb_gen_c_json_parser_cold_3();
                      goto LAB_00112d20;
                    }
                    pcVar31 = "buf = %s_parse_json_struct(ctx, buf, end, result);";
                  }
                  pcStack_858 = (code *)0x1119ea;
                  println((fb_output_t *)pcVar40,pcVar31,auStack_830);
                  pcStack_858 = (code *)0x1119fb;
                  println((fb_output_t *)pcVar40,"break;");
                  iVar11 = ((fb_output_t *)pcVar40)->indent;
                  if (iVar11 == 0) goto LAB_00112cdd;
                }
                ((fb_output_t *)pcVar40)->indent = iVar11 + -1;
              }
            }
            pcStack_858 = (code *)0x111a7b;
            println((fb_output_t *)pcVar40,"default:");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111a92;
            println((fb_output_t *)pcVar40,
                    "if (!(ctx->flags & flatcc_json_parser_f_skip_unknown)) {");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111aa9;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_unknown_union);"
                   );
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112f77;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63c,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111ad0;
            println((fb_output_t *)pcVar40,"} else {");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111ae7;
            println((fb_output_t *)pcVar40,"return flatcc_json_parser_generic_json(ctx, buf, end);")
            ;
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112f58;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63e,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111b18;
            println((fb_output_t *)pcVar40,"}");
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112f39;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x63f,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111b3b;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x111b4c;
            println((fb_output_t *)pcVar40,"if (ctx->error) return buf;");
            pcStack_858 = (code *)0x111b5d;
            println((fb_output_t *)pcVar40,"if (!*result) {");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111b74;
            println((fb_output_t *)pcVar40,
                    "return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);"
                   );
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112f1a;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x643,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111b97;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x111ba8;
            println((fb_output_t *)pcVar40,"return buf;");
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112efb;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x645,"int gen_union_parser(fb_output_t *, fb_compound_type_t *)");
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111bcb;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x111bdc;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x111beb;
            memset((fb_scoped_name_t *)auStack_740,0,0xe8);
            pcStack_858 = (code *)0x111bfa;
            __flatcc_fb_scoped_symbol_name
                      (ct_00->scope,&ct_00->symbol,(fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x111c0e;
            println((fb_output_t *)pcVar40,"static int %s_json_union_accept_type(uint8_t type)",
                    (fb_scoped_name_t *)auStack_740);
            pcStack_858 = (code *)0x111c1b;
            println((fb_output_t *)pcVar40,"{");
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
            pcStack_858 = (code *)0x111c32;
            println((fb_output_t *)pcVar40,"switch (type) {");
            for (pfVar28 = ct_00->members; pfVar28 != (fb_symbol_t *)0x0; pfVar28 = pfVar28->link) {
              if (pfVar28[1].kind == 0) {
                pcStack_858 = (code *)0x111c78;
                println((fb_output_t *)pcVar40,"case 0: return 1; /* NONE */");
              }
              else {
                pfVar35 = (fb_output_t *)pfVar28->ident->text;
                pcStack_858 = (code *)0x111c69;
                println((fb_output_t *)pcVar40,"case %u: return 1; /* %.*s */",
                        (ulong)*(uint *)&pfVar28[3].link,(ulong)(uint)pfVar28->ident->len);
              }
            }
            pcStack_858 = (code *)0x111c91;
            println((fb_output_t *)pcVar40,"default: return 0;");
            iVar11 = ((fb_output_t *)pcVar40)->indent;
            uVar10 = iVar11 + 1;
            pcVar20 = (code *)(ulong)uVar10;
            ((fb_output_t *)pcVar40)->indent = uVar10;
            if (uVar10 == 0) {
              pcStack_858 = (code *)0x112edc;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x663,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)")
              ;
            }
            ((fb_output_t *)pcVar40)->indent = iVar11;
            pcStack_858 = (code *)0x111cc1;
            println((fb_output_t *)pcVar40,"}");
            if (((fb_output_t *)pcVar40)->indent == 0) {
              pcStack_858 = (code *)0x112f96;
              __assert_fail("out->indent",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                            ,0x664,"int gen_union_accept_type(fb_output_t *, fb_compound_type_t *)")
              ;
            }
            ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
            pcStack_858 = (code *)0x111ceb;
            println((fb_output_t *)pcVar40,"}");
            pcStack_858 = (code *)0x111cff;
            println((fb_output_t *)pcVar40,"");
            pcStack_858 = (code *)0x111d0a;
            gen_enum_parser((fb_output_t *)pcVar40,ct_00);
          }
          ct_00 = (fb_compound_type_t *)(ct_00->symbol).link;
        } while (ct_00 != (fb_compound_type_t *)0x0);
        pfVar13 = ((fb_output_t *)pcVar40)->S;
      }
      pcStack_858 = (code *)0x112487;
      fb_scope_table_visit(&pfVar13->root_schema->scope_index,gen_local_scope_parser,pcVar40);
      auStack_830 = (undefined1  [8])0x0;
      pgStack_828 = (gen_match_f *)0x0;
      pgStack_820 = (gen_unmatched_f *)0x0;
      pfStack_818 = (fb_compound_type_t *)0x0;
      uStack_810._0_4_ = 0;
      uStack_810._4_4_ = 0;
      uStack_808._0_4_ = 0;
      uStack_808._4_4_ = 0;
      pfStack_6e8 = ((fb_output_t *)pcVar40)->S;
      pfStack_840 = pfStack_6e8->root_schema;
      auStack_740._8_8_ = 0;
      peStack_700 = (enum_entry_t *)0x0;
      psStack_6f8 = (service_entry_t *)0x0;
      pcStack_710 = (char *)0x0;
      poStack_708 = (object_entry_t *)0x0;
      peStack_720 = (enum_entry_t *)0x0;
      psStack_718 = (service_entry_t *)0x0;
      auStack_740._16_8_ = 0;
      poStack_728 = (object_entry_t *)0x0;
      pcStack_6f0 = (char *)0x0;
      auStack_740._0_4_ = 1;
      auStack_740._4_4_ = 0;
      pcStack_858 = (code *)0x1124eb;
      fb_scope_table_visit(&pfStack_840->scope_index,count_symbols,auStack_740);
      bStack_849 = 0 < (long)(int)auStack_740._4_4_;
      pcStack_858 = (code *)0x112501;
      peVar14 = (entry_t *)calloc((long)(int)auStack_740._4_4_,0x10);
      uVar8 = auStack_740._8_4_;
      uVar12 = auStack_740._8_8_ & 0xffffffff;
      pcStack_858 = (code *)0x112519;
      poStack_728 = peVar14;
      peVar15 = (entry_t *)calloc((long)(int)auStack_740._8_4_,0x10);
      iStack_844 = auStack_740._12_4_;
      pcStack_858 = (code *)0x112535;
      peStack_720 = peVar15;
      peVar16 = (entry_t *)calloc((long)(int)auStack_740._12_4_,0x10);
      sStack_838 = auStack_740._16_8_;
      pcStack_858 = (code *)0x11254a;
      psStack_718 = peVar16;
      pcStack_710 = (char *)malloc(auStack_740._16_8_);
      poStack_708 = peVar14;
      peStack_700 = peVar15;
      psStack_6f8 = peVar16;
      pcStack_6f0 = pcStack_710;
      if (((((bStack_849 & peVar14 == (entry_t *)0x0) == 0) &&
           ((int)uVar8 < 1 || peVar15 != (entry_t *)0x0)) &&
          (iStack_844 < 1 || peVar16 != (entry_t *)0x0)) &&
         (uVar21 = CONCAT71((int7)((ulong)pcVar20 >> 8),sStack_838 != 0),
         sStack_838 == 0 || pcStack_710 != (char *)0x0)) {
        pcStack_858 = (code *)0x1125cb;
        fb_scope_table_visit(&pfStack_840->scope_index,install_symbols,auStack_740);
        pcStack_858 = (code *)0x1125d8;
        sort_entries(poStack_728,auStack_740._4_4_);
        pcStack_858 = (code *)0x1125e5;
        sort_entries(peStack_720,auStack_740._8_4_);
        pcVar31 = (char *)(ulong)(uint)auStack_740._12_4_;
        pcStack_858 = (code *)0x1125f2;
        sort_entries(psStack_718,auStack_740._12_4_);
        iVar11 = auStack_740._8_4_;
        sVar42 = (size_t)(int)auStack_740._8_4_;
        if (sVar42 == 0) {
          iVar11 = 0;
          auStack_830 = (undefined1  [8])0x0;
        }
        else {
          pcStack_858 = (code *)0x112607;
          __base = (dict_entry_t *)malloc(sVar42 << 5);
          peVar9 = peStack_720;
          if (__base == (dict_entry_t *)0x0) {
            auStack_830 = (undefined1  [8])0x0;
            if (0 < iVar11) {
              puVar34 = auStack_740;
              pcStack_858 = println;
              __flatcc_fb_gen_c_json_parser_cold_5();
              if (println_spaces[0] == '\0') {
                builtin_strncpy(println_spaces + 0x30,"                ",0x10);
                builtin_strncpy(println_spaces + 0x20,"                ",0x10);
                builtin_strncpy(println_spaces + 0x10,"                ",0x10);
                builtin_strncpy(println_spaces,"                ",0x10);
              }
              uStack_910 = uVar21;
              pfStack_908 = pfVar35;
              pfStack_900 = pfVar36;
              pfStack_878 = (fb_output_t *)pcVar40;
              uStack_870 = uVar12;
              peStack_868 = peVar14;
              sStack_860 = sVar42;
              pcStack_858 = (code *)auStack_740;
              if (*pcVar31 != '\0') {
                uVar39 = *(int *)(*(long *)(puVar34 + 0xe0) + 0xd0) * *(int *)(puVar34 + 0xf0);
                uVar10 = uVar39;
                if (0x40 < (int)uVar39) {
                  do {
                    fprintf(*(FILE **)(puVar34 + 0xd0),"%.*s",0x40,println_spaces);
                    uVar10 = uVar39 - 0x40;
                    bVar43 = 0x80 < uVar39;
                    uVar39 = uVar10;
                  } while (bVar43);
                }
                fprintf(*(FILE **)(puVar34 + 0xd0),"%.*s",(ulong)uVar10,println_spaces);
                uStack_948 = 0x3000000010;
                puStack_940 = &uStack_848;
                puStack_938 = auStack_928;
                vfprintf(*(FILE **)(puVar34 + 0xd0),pcVar31,&uStack_948);
              }
              iVar11 = fputc(10,*(FILE **)(puVar34 + 0xd0));
              return iVar11;
            }
          }
          else {
            lVar38 = 8;
            sVar30 = sVar42;
            do {
              pcVar31 = *(char **)((long)&peVar9->ct + lVar38);
              *(char **)((long)__base + lVar38 * 2 + -0x10) = pcVar31;
              pcStack_858 = (code *)0x11262f;
              sVar17 = strlen(pcVar31);
              *(int *)((long)__base + lVar38 * 2 + -8) = (int)sVar17;
              *(undefined8 *)((long)&__base->text + lVar38 * 2) =
                   *(undefined8 *)((long)peVar9 + lVar38 + -8);
              *(undefined4 *)((long)&__base->len + lVar38 * 2) = 0;
              lVar38 = lVar38 + 0x10;
              sVar30 = sVar30 - 1;
            } while (sVar30 != 0);
            pcStack_858 = (code *)0x112666;
            qsort(__base,sVar42,0x20,dict_cmp);
            iVar11 = auStack_740._8_4_;
            auStack_830 = (undefined1  [8])__base;
          }
        }
        pfStack_818 = (fb_compound_type_t *)0x0;
        uStack_810._0_4_ = 4;
        pgStack_828 = gen_scope_match;
        pgStack_820 = gen_scope_unmatched;
        pcStack_858 = (code *)0x1126d7;
        println((fb_output_t *)pcVar40,
                "static const char *%s_global_json_parser_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,"
                ,((fb_output_t *)pcVar40)->S->basename);
        ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
        pcStack_858 = (code *)0x1126ef;
        println((fb_output_t *)pcVar40,"int *value_type, uint64_t *value, int *aggregate)");
        iVar18 = ((fb_output_t *)pcVar40)->indent;
        if ((iVar18 == 0) || (((fb_output_t *)pcVar40)->indent = iVar18 + -1, iVar18 + -1 == 0)) {
          pcStack_858 = (code *)0x1130cc;
          __assert_fail("out->indent",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                        ,0x4ea,"int gen_global_scope_parser(fb_output_t *)");
        }
        ((fb_output_t *)pcVar40)->indent = iVar18 + -2;
        pcStack_858 = (code *)0x112727;
        println((fb_output_t *)pcVar40,"{");
        ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
        if (iVar11 == 0) {
          pcStack_858 = (code *)0x1127ee;
          println((fb_output_t *)pcVar40,"/* Global scope has no enum / union types to look up. */")
          ;
          pcStack_858 = (code *)0x1127ff;
          println((fb_output_t *)pcVar40,"return buf; /* unmatched; */");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if (iVar11 == 0) {
            pcStack_858 = (code *)0x1130eb;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x4ef,"int gen_global_scope_parser(fb_output_t *)");
          }
        }
        else {
          pcStack_858 = (code *)0x112747;
          println((fb_output_t *)pcVar40,"const char *unmatched = buf;");
          pcStack_858 = (code *)0x112758;
          println((fb_output_t *)pcVar40,"const char *mark;");
          pcStack_858 = (code *)0x112769;
          println((fb_output_t *)pcVar40,"uint64_t w;");
          pcStack_858 = (code *)0x11277a;
          println((fb_output_t *)pcVar40,"");
          pcStack_858 = (code *)0x11278b;
          println((fb_output_t *)pcVar40,"w = flatcc_json_parser_symbol_part(buf, end);");
          pcStack_858 = (code *)0x1127a3;
          gen_trie((fb_output_t *)pcVar40,(trie_t *)auStack_830,0,iVar11 + -1,0);
          pcStack_858 = (code *)0x1127b4;
          println((fb_output_t *)pcVar40,"return buf;");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if (iVar11 == 0) {
            pcStack_858 = (code *)0x1127dd;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x4f8,"int gen_global_scope_parser(fb_output_t *)");
          }
        }
        ((fb_output_t *)pcVar40)->indent = iVar11 + -1;
        pcStack_858 = (code *)0x112826;
        println((fb_output_t *)pcVar40,"}");
        pcStack_858 = (code *)0x112837;
        println((fb_output_t *)pcVar40,"");
        if (auStack_830 != (undefined1  [8])0x0) {
          pcStack_858 = (code *)0x112846;
          free((void *)auStack_830);
        }
      }
      pcStack_858 = (code *)0x112853;
      clear_catalog((catalog_t *)auStack_740);
      pfVar28 = (((fb_output_t *)pcVar40)->S->root_type).type;
      if (pfVar28 != (fb_symbol_t *)0x0) {
        if (pfVar28->kind == 1) {
          pcStack_858 = (code *)0x1129b3;
          memset((fb_scoped_name_t *)auStack_740,0,0xe8);
          pcStack_858 = (code *)0x1129c2;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
          pcStack_858 = (code *)0x1129e1;
          println((fb_output_t *)pcVar40,
                  "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
                  ((fb_output_t *)pcVar40)->S->basename);
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
          pcStack_858 = (code *)0x1129f9;
          println((fb_output_t *)pcVar40,"const char *buf, size_t bufsiz, int flags)");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if ((iVar11 == 0) || (((fb_output_t *)pcVar40)->indent = iVar11 + -1, iVar11 + -1 == 0)) {
            pcStack_858 = (code *)0x113050;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6a2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar40)->indent = iVar11 + -2;
          pcStack_858 = (code *)0x112a31;
          println((fb_output_t *)pcVar40,"{");
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
          pcStack_858 = (code *)0x112a48;
          println((fb_output_t *)pcVar40,"flatcc_json_parser_t ctx_;");
          pcStack_858 = (code *)0x112a59;
          println((fb_output_t *)pcVar40,"flatcc_builder_ref_t root;");
          pcStack_858 = (code *)0x112a6a;
          println((fb_output_t *)pcVar40,"");
          pcStack_858 = (code *)0x112a7b;
          println((fb_output_t *)pcVar40,"ctx = ctx ? ctx : &ctx_;");
          pcStack_858 = (code *)0x112a8c;
          println((fb_output_t *)pcVar40,
                  "flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
          pfVar13 = ((fb_output_t *)pcVar40)->S;
          if ((pfVar13->file_identifier).type == 3) {
            pcStack_858 = (code *)0x112ab6;
            println((fb_output_t *)pcVar40,
                    "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                    (ulong)(uint)(pfVar13->file_identifier).field_0.s.len,
                    (pfVar13->file_identifier).field_0.s.s);
          }
          else {
            pcStack_858 = (code *)0x112ba5;
            println((fb_output_t *)pcVar40,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;"
                   );
          }
          pcStack_858 = (code *)0x112bbe;
          println((fb_output_t *)pcVar40,
                  "buf = %s_parse_json_struct(ctx, buf, buf + bufsiz, &root);",auStack_740);
          pcStack_858 = (code *)0x112bcf;
          println((fb_output_t *)pcVar40,"if (ctx->error) {");
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
          pcStack_858 = (code *)0x112be6;
          println((fb_output_t *)pcVar40,"return ctx->error;");
          if (((fb_output_t *)pcVar40)->indent == 0) {
            pcStack_858 = (code *)0x11308e;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6b2,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
          pcStack_858 = (code *)0x112c0d;
          println((fb_output_t *)pcVar40,"}");
          pcStack_858 = (code *)0x112c1e;
          println((fb_output_t *)pcVar40,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
          pcStack_858 = (code *)0x112c2f;
          println((fb_output_t *)pcVar40,"ctx->end_loc = buf;");
          pcStack_858 = (code *)0x112c40;
          println((fb_output_t *)pcVar40,"return 0;");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if (iVar11 == 0) {
            pcStack_858 = (code *)0x1130ad;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x6b6,"int gen_root_struct_parser(fb_output_t *, fb_compound_type_t *)");
          }
        }
        else {
          if (pfVar28->kind != 0) goto LAB_00112c78;
          pcStack_858 = (code *)0x112894;
          memset((fb_scoped_name_t *)auStack_740,0,0xe8);
          pcStack_858 = (code *)0x1128a3;
          __flatcc_fb_scoped_symbol_name
                    ((fb_scope_t *)pfVar28[1].link,pfVar28,(fb_scoped_name_t *)auStack_740);
          pcStack_858 = (code *)0x1128c2;
          println((fb_output_t *)pcVar40,
                  "static int %s_parse_json(flatcc_builder_t *B, flatcc_json_parser_t *ctx,",
                  ((fb_output_t *)pcVar40)->S->basename);
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 2;
          pcStack_858 = (code *)0x1128da;
          println((fb_output_t *)pcVar40,
                  "const char *buf, size_t bufsiz, flatcc_json_parser_flags_t flags)");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if ((iVar11 == 0) || (((fb_output_t *)pcVar40)->indent = iVar11 + -1, iVar11 + -1 == 0)) {
            pcStack_858 = (code *)0x113031;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x67f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar40)->indent = iVar11 + -2;
          pcStack_858 = (code *)0x112912;
          println((fb_output_t *)pcVar40,"{");
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
          pcStack_858 = (code *)0x112929;
          println((fb_output_t *)pcVar40,"flatcc_json_parser_t parser;");
          pcStack_858 = (code *)0x11293a;
          println((fb_output_t *)pcVar40,"flatcc_builder_ref_t root;");
          pcStack_858 = (code *)0x11294b;
          println((fb_output_t *)pcVar40,"");
          pcStack_858 = (code *)0x11295c;
          println((fb_output_t *)pcVar40,"ctx = ctx ? ctx : &parser;");
          pcStack_858 = (code *)0x11296d;
          println((fb_output_t *)pcVar40,
                  "flatcc_json_parser_init(ctx, B, buf, buf + bufsiz, flags);");
          pfVar13 = ((fb_output_t *)pcVar40)->S;
          if ((pfVar13->file_identifier).type == 3) {
            pcStack_858 = (code *)0x112997;
            println((fb_output_t *)pcVar40,
                    "if (flatcc_builder_start_buffer(B, \"%.*s\", 0, 0)) return -1;",
                    (ulong)(uint)(pfVar13->file_identifier).field_0.s.len,
                    (pfVar13->file_identifier).field_0.s.s);
          }
          else {
            pcStack_858 = (code *)0x112acc;
            println((fb_output_t *)pcVar40,"if (flatcc_builder_start_buffer(B, 0, 0, 0)) return -1;"
                   );
          }
          pcStack_858 = (code *)0x112ae5;
          println((fb_output_t *)pcVar40,"%s_parse_json_table(ctx, buf, buf + bufsiz, &root);",
                  auStack_740);
          pcStack_858 = (code *)0x112af6;
          println((fb_output_t *)pcVar40,"if (ctx->error) {");
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + 1;
          pcStack_858 = (code *)0x112b0d;
          println((fb_output_t *)pcVar40,"return ctx->error;");
          if (((fb_output_t *)pcVar40)->indent == 0) {
            pcStack_858 = (code *)0x11306f;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x68f,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
          ((fb_output_t *)pcVar40)->indent = ((fb_output_t *)pcVar40)->indent + -1;
          pcStack_858 = (code *)0x112b34;
          println((fb_output_t *)pcVar40,"}");
          pcStack_858 = (code *)0x112b45;
          println((fb_output_t *)pcVar40,"if (!flatcc_builder_end_buffer(B, root)) return -1;");
          pcStack_858 = (code *)0x112b56;
          println((fb_output_t *)pcVar40,"ctx->end_loc = buf;");
          pcStack_858 = (code *)0x112b67;
          println((fb_output_t *)pcVar40,"return 0;");
          iVar11 = ((fb_output_t *)pcVar40)->indent;
          if (iVar11 == 0) {
            pcStack_858 = (code *)0x112b94;
            __assert_fail("out->indent",
                          "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                          ,0x693,"int gen_root_table_parser(fb_output_t *, fb_compound_type_t *)");
          }
        }
        ((fb_output_t *)pcVar40)->indent = iVar11 + -1;
        pcStack_858 = (code *)0x112c67;
        println((fb_output_t *)pcVar40,"}");
        pcStack_858 = (code *)0x112c78;
        println((fb_output_t *)pcVar40,"");
      }
LAB_00112c78:
      if (((fb_output_t *)pcVar40)->opts->cgen_pragmas != 0) {
        pcStack_858 = (code *)0x112ca5;
        fwrite("#include \"flatcc/flatcc_epilogue.h\"\n",0x24,1,(FILE *)((fb_output_t *)pcVar40)->fp
              );
      }
      pcStack_858 = (code *)0x112cc4;
      println((fb_output_t *)pcVar40,"#endif /* %s_JSON_PARSER_H */",
              ((fb_output_t *)pcVar40)->S->basenameup);
      return 0;
    }
  }
  pcStack_858 = (code *)0x112fb5;
  __assert_fail("out->indent",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/compiler/codegen_c_json_parser.c"
                ,0x711,"int gen_json_parser_prototypes(fb_output_t *)");
}

Assistant:

static int gen_union_fields(fb_output_t *out, const char *st, int n, const char *s,
        fb_compound_type_t *ct, int is_vector)
{
    const char *nsc = out->nsc;
    fb_symbol_t *sym;
    fb_member_t *member;
    const char *su;
    int nu;
    fb_scoped_name_t snref;
    fb_scoped_name_t snu;
    const char *kind = is_vector ? "vector_value" : "value";

    fb_clear(snref);
    fb_clear(snu);
    fb_compound_name(ct, &snref);
    for (sym = ct->members; sym; sym = sym->link) {
        member = (fb_member_t *)sym;
        symbol_name(sym, &nu, &su);
        switch (member->type.type) {
        case vt_missing:
            break;
        case vt_compound_type_ref:
            fb_compound_name(member->type.ct, &snu);
            switch (member->type.ct->symbol.kind) {
            case fb_is_table:
                fprintf(out->fp,
                        "__%sbuild_union_table_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            case fb_is_struct:
                fprintf(out->fp,
                        "__%sbuild_union_struct_%s_field(%s, %s_%.*s, %s, %.*s, %s)\n",
                        nsc, kind, nsc, st, n, s, snref.text, nu, su, snu.text);
                break;
            default:
                gen_panic(out, "internal error: unexpected union member compound type");
                return -1;
            }
            break;
        case vt_string_type:
            fprintf(out->fp,
                    "__%sbuild_union_string_%s_field(%s, %s_%.*s, %s, %.*s)\n",
                    nsc, kind, nsc, st, n, s, snref.text, nu, su);
            break;
        default:
            gen_panic(out, "internal error: unexpected union member type");
            return -1;
        }
    }
    return 0;
}